

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaders.cpp
# Opt level: O0

void gpu::uploadShaderSources<char_const*,char*>(u32 shader,char **xs,char **xs_1)

{
  i32 local_40;
  i32 local_3c;
  i32 sizes [2];
  char *srcs [2];
  char **xs_local_1;
  char **xs_local;
  u32 shader_local;
  
  sizes = (i32  [2])*xs;
  local_40 = strlenGeneric(*xs);
  local_3c = strlenGeneric(*xs_1);
  (*glad_debug_glShaderSource)(shader,2,(GLchar **)sizes,&local_40);
  return;
}

Assistant:

void uploadShaderSources(u32 shader, const Ts&... xs)
{
    const char* const srcs[] = { xs... };
    const i32 sizes[] = { strlenGeneric(xs)... };
   glShaderSource(shader, sizeof...(xs), srcs, sizes);
}